

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.c
# Opt level: O1

uint16_t vpatch(dw_rom *rom,uint32_t address,uint32_t size,...)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t *local_d0;
  uint8_t local_b8 [56];
  va_list arg;
  
  puVar1 = rom->content + address;
  local_d0 = &stack0x00000008;
  uVar3 = 0x18;
  if (size != 0) {
    do {
      uVar4 = (ulong)uVar3;
      if (uVar4 < 0x29) {
        uVar3 = uVar3 + 8;
        puVar2 = local_b8 + uVar4;
      }
      else {
        puVar2 = local_d0;
        local_d0 = local_d0 + 8;
      }
      *puVar1 = *puVar2;
      puVar1 = puVar1 + 1;
      size = size - 1;
    } while (size != 0);
  }
  return (short)puVar1 - (short)*(undefined4 *)&rom->content;
}

Assistant:

uint16_t vpatch(const dw_rom *rom, const uint32_t address, const uint32_t size,
        ...)
{
    uint32_t i;
    va_list arg;
    uint8_t *p;

    p = &rom->content[address];
    va_start(arg, size);

    for (i=0; i < size; i++) {
        *(p++) = va_arg(arg, int);
    }
    va_end(arg);
    return p - rom->content;
}